

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O2

bool __thiscall
ON_NurbsCage::SetCV(ON_NurbsCage *this,int i,int j,int k,point_style style,double *Point)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  double *__dest;
  int iVar4;
  ulong uVar5;
  long lVar6;
  size_t __n;
  ulong uVar7;
  bool bVar8;
  ulong uVar9;
  
  __dest = CV(this,i,j,k);
  if (__dest == (double *)0x0) {
LAB_0055e56d:
    return false;
  }
  switch(style) {
  case not_rational:
    memcpy(__dest,Point,(long)this->m_dim << 3);
    if (this->m_is_rat == true) {
      __dest[this->m_dim] = 1.0;
      return true;
    }
    return true;
  case homogeneous_rational:
    uVar3 = this->m_dim;
    if (this->m_is_rat != true) {
      dVar1 = Point[(int)uVar3];
      uVar9 = -(ulong)(dVar1 != 0.0);
      uVar5 = 0;
      uVar7 = 0;
      if (0 < (int)uVar3) {
        uVar7 = (ulong)uVar3;
      }
      for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        __dest[uVar5] =
             Point[uVar5] * (double)(~uVar9 & 0x3ff0000000000000 | (ulong)(1.0 / dVar1) & uVar9);
      }
      return true;
    }
    __n = (long)(int)uVar3 * 8 + 8;
    goto LAB_0055e560;
  case euclidean_rational:
    iVar2 = this->m_dim;
    lVar6 = (long)iVar2;
    if (this->m_is_rat == true) {
      dVar1 = Point[lVar6];
      iVar4 = 0;
      if (0 < iVar2) {
        iVar4 = iVar2;
      }
      while (bVar8 = iVar4 != 0, iVar4 = iVar4 + -1, bVar8) {
        __dest[i] = Point[i] * dVar1;
      }
      __dest[lVar6] = dVar1;
      return true;
    }
    break;
  case intrinsic_point_style:
    lVar6 = (long)this->m_dim + (ulong)this->m_is_rat;
    break;
  default:
    goto LAB_0055e56d;
  }
  __n = lVar6 << 3;
LAB_0055e560:
  memcpy(__dest,Point,__n);
  return true;
}

Assistant:

bool ON_NurbsCage::SetCV( int i, int j, int k, ON::point_style style, const double* Point )
{
  bool rc = true;
  int n;
  double w;

  double* cv = CV(i,j,k);
  if ( !cv )
    return false;

  switch ( style ) {

  case ON::not_rational:  // input Point is not rational
    memcpy( cv, Point, m_dim*sizeof(*cv) );
    if ( IsRational() ) {
      // NURBS surface is rational - set weight to one
      cv[m_dim] = 1.0;
    }
    break;

  case ON::homogeneous_rational:  // input Point is homogeneous rational
    if ( IsRational() ) {
      // NURBS surface is rational
      memcpy( cv, Point, (m_dim+1)*sizeof(*cv) );
    }
    else {
      // NURBS surface is not rational
      w = (Point[m_dim] != 0.0) ? 1.0/Point[m_dim] : 1.0;
      for ( n = 0; n < m_dim; n++ ) {
        cv[n] = w*Point[n];
      }
    }
    break;

  case ON::euclidean_rational:  // input Point is euclidean rational
    if ( IsRational() ) {
      // NURBS surface is rational - convert euclean point to homogeneous form
      w = Point[m_dim];
      for ( n = 0; n < m_dim; n++ )
        cv[i] = w*Point[i];
      cv[m_dim] = w;
    }
    else {
      // NURBS surface is not rational
      memcpy( cv, Point, m_dim*sizeof(*cv) );
    }
    break;

  case ON::intrinsic_point_style:
    n = m_is_rat?m_dim+1:m_dim;
    memcpy(cv,Point,n*sizeof(*cv));
    break;
    
  default:
    rc = false;
    break;
  }
  return rc;
}